

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Ivy_Man_t * Abc_NtkToIvy(Abc_Ntk_t *pNtkOld)

{
  int iVar1;
  Ivy_Man_t *p;
  Ivy_Obj_t *pIVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_2c;
  int i;
  Ivy_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Ivy_Man_t *pMan;
  Abc_Ntk_t *pNtkOld_local;
  
  iVar1 = Abc_NtkHasSop(pNtkOld);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsStrash(pNtkOld), iVar1 == 0)) {
    __assert_fail("Abc_NtkHasSop(pNtkOld) || Abc_NtkIsStrash(pNtkOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                  ,0x388,"Ivy_Man_t *Abc_NtkToIvy(Abc_Ntk_t *)");
  }
  p = Ivy_ManStart();
  iVar1 = Abc_NtkIsStrash(pNtkOld);
  if (iVar1 != 0) {
    pIVar2 = Ivy_ManConst1(p);
    pAVar3 = Abc_AigConst1(pNtkOld);
    (pAVar3->field_6).pCopy = (Abc_Obj_t *)pIVar2;
  }
  for (local_2c = 0; iVar1 = Abc_NtkCiNum(pNtkOld), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = Abc_NtkCi(pNtkOld,local_2c);
    pIVar2 = Ivy_ObjCreatePi(p);
    (pAVar3->field_6).pCopy = (Abc_Obj_t *)pIVar2;
  }
  Abc_NtkStrashPerformAig(pNtkOld,p);
  for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtkOld), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = Abc_NtkCo(pNtkOld,local_2c);
    pAVar4 = Abc_ObjFanin0(pAVar3);
    pIVar2 = (Ivy_Obj_t *)(pAVar4->field_6).pCopy;
    iVar1 = Abc_ObjFaninC0(pAVar3);
    pIVar2 = Ivy_NotCond(pIVar2,iVar1);
    Ivy_ObjCreatePo(p,pIVar2);
  }
  Ivy_ManCleanup(p);
  return p;
}

Assistant:

Ivy_Man_t * Abc_NtkToIvy( Abc_Ntk_t * pNtkOld )
{
    Ivy_Man_t * pMan;
    Abc_Obj_t * pObj;
    Ivy_Obj_t * pFanin;
    int i;
    // create the manager
    assert( Abc_NtkHasSop(pNtkOld) || Abc_NtkIsStrash(pNtkOld) );
    pMan = Ivy_ManStart();
    // create the PIs
    if ( Abc_NtkIsStrash(pNtkOld) )
        Abc_AigConst1(pNtkOld)->pCopy = (Abc_Obj_t *)Ivy_ManConst1(pMan);
    Abc_NtkForEachCi( pNtkOld, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Ivy_ObjCreatePi(pMan);
    // perform the conversion of the internal nodes
    Abc_NtkStrashPerformAig( pNtkOld, pMan );
    // create the POs
    Abc_NtkForEachCo( pNtkOld, pObj, i )
    {
        pFanin = (Ivy_Obj_t *)Abc_ObjFanin0(pObj)->pCopy;
        pFanin = Ivy_NotCond( pFanin, Abc_ObjFaninC0(pObj) );
        Ivy_ObjCreatePo( pMan, pFanin );
    }
    Ivy_ManCleanup( pMan );
    return pMan;
}